

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O1

char * expand_text_(char *from,char **buf,int maxbuf,double maxw,int *n,double *width,int wrap,
                   int draw_symbols)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *__s;
  byte *pbVar8;
  byte *pbVar9;
  char *pcVar10;
  byte *pbVar11;
  size_t __size;
  double extraout_XMM0_Qa;
  double dVar12;
  double extraout_XMM0_Qa_00;
  byte *local_60;
  double local_58;
  
  pcVar10 = *buf + maxbuf;
  underline_at = (char *)0x0;
  if (expand_text_(char_const*,char*&,int,double,int&,double&,int,int)::local_buf == '\0') {
    expand_text_();
  }
  pcVar4 = expand_text_::local_buf;
  if (maxbuf == 0) {
    *buf = expand_text_::local_buf;
    pcVar10 = pcVar4 + expand_text_::l_local_buff;
  }
  pbVar11 = (byte *)(pcVar10 + -4);
  __s = (byte *)*buf;
  local_58 = 0.0;
  pbVar9 = (byte *)from;
  local_60 = __s;
  do {
    bVar1 = *pbVar9;
    if (((ulong)bVar1 < 0x21) && ((0x100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      if ((wrap == 0) || (pbVar9 <= from)) {
LAB_001e9d45:
        if (bVar1 != 0) {
          if (bVar1 != 10) {
            from = (char *)(pbVar9 + 1);
            goto LAB_001e9d65;
          }
          pbVar9 = pbVar9 + 1;
        }
LAB_001e9d77:
        bVar3 = true;
        pbVar8 = pbVar9;
      }
      else {
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,local_60,(ulong)(uint)((int)__s - (int)local_60));
        dVar12 = extraout_XMM0_Qa + local_58;
        bVar2 = local_60 <= *buf;
        pbVar8 = (byte *)from;
        if (dVar12 <= maxw || bVar2) {
          pbVar8 = pbVar9;
          local_60 = __s;
          local_58 = dVar12;
        }
        bVar3 = maxw < dVar12 && !bVar2;
        __s = local_60;
        pbVar9 = pbVar8;
        if (dVar12 <= maxw || bVar2) goto LAB_001e9d45;
      }
    }
    else {
LAB_001e9d65:
      pcVar10 = expand_text_::local_buf;
      if (pbVar11 < __s) {
        if (maxbuf != 0) goto LAB_001e9d77;
        expand_text_::l_local_buff = ((int)__s - (int)pbVar11) + expand_text_::l_local_buff + 200;
        __size = (size_t)expand_text_::l_local_buff;
        expand_text_::local_buf = (char *)realloc(expand_text_::local_buf,__size);
        *buf = expand_text_::local_buf;
        pbVar11 = (byte *)(expand_text_::local_buf + (__size - 4));
        __s = (byte *)(expand_text_::local_buf + ((long)__s - (long)pcVar10));
        local_60 = (byte *)(expand_text_::local_buf + ((long)local_60 - (long)pcVar10));
      }
      pbVar8 = pbVar9;
      if (bVar1 == 9) {
        uVar5 = fl_utf_nb_char((uchar *)*buf,(int)__s - (int)*buf);
        bVar3 = false;
        if (__s < pbVar11) {
          uVar6 = uVar5 + 7;
          if (-1 < (int)uVar5) {
            uVar6 = uVar5;
          }
          pbVar7 = (byte *)(ulong)(((uVar6 & 0xfffffff8) - uVar5) + 7);
          pbVar9 = pbVar11 + ~(ulong)__s;
          if (pbVar7 <= pbVar11 + ~(ulong)__s) {
            pbVar9 = pbVar7;
          }
          memset(__s,0x20,(size_t)(pbVar9 + 1));
          __s = __s + (long)pbVar9 + 1;
        }
      }
      else {
        if ((fl_draw_shortcut == '\0' || bVar1 != 0x26) || (pbVar9[1] == 0)) {
          if (bVar1 < 0x20 || bVar1 == 0x7f) {
            *__s = 0x5e;
            __s[1] = bVar1 ^ 0x40;
            __s = __s + 2;
          }
          else {
            if ((draw_symbols == 0) || (bVar1 != 0x40)) {
              *__s = bVar1;
              goto LAB_001e9edc;
            }
            if ((pbVar9[1] & 0xbf) != 0) {
              bVar3 = true;
              goto LAB_001e9ee2;
            }
            *__s = 0x40;
            __s = __s + 1;
            if (pbVar9[1] != 0) {
              pbVar9 = pbVar9 + 1;
            }
          }
        }
        else {
          if (pbVar9[1] != 0x26) {
            bVar3 = false;
            if (fl_draw_shortcut != '\x02') {
              underline_at = (char *)__s;
            }
            goto LAB_001e9ee2;
          }
          pbVar9 = pbVar9 + 1;
          *__s = 0x26;
LAB_001e9edc:
          __s = __s + 1;
        }
        bVar3 = false;
        pbVar8 = pbVar9;
      }
    }
LAB_001e9ee2:
    pbVar9 = pbVar8 + 1;
    if (bVar3) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                (fl_graphics_driver,local_60,(ulong)(uint)((int)__s - (int)local_60));
      *width = local_58 + extraout_XMM0_Qa_00;
      *__s = 0;
      *n = (int)__s - *(int *)buf;
      return (char *)pbVar8;
    }
  } while( true );
}

Assistant:

static const char* expand_text_(const char* from, char*& buf, int maxbuf, double maxw, int& n,
	       double &width, int wrap, int draw_symbols) {
  char* e = buf+(maxbuf-4);
  underline_at = 0;
  double w = 0;
  static int l_local_buff = 500;
  static char *local_buf = (char*)malloc(l_local_buff); // initial buffer allocation
  if (maxbuf == 0) {
    buf = local_buf;
    e = buf + l_local_buff - 4;
    }
  char* o = buf;
  char* word_end = o;
  const char* word_start = from;

  const char* p = from;
  for (;; p++) {

    int c = *p & 255;

    if (!c || c == ' ' || c == '\n') {
      // test for word-wrap:
      if (word_start < p && wrap) {
	double newwidth = w + fl_width(word_end, (int) (o-word_end) );
	if (word_end > buf && newwidth > maxw) { // break before this word
	  o = word_end;
	  p = word_start;
	  break;
	}
	word_end = o;
	w = newwidth;
      }
      if (!c) break;
      else if (c == '\n') {p++; break;}
      word_start = p+1;
    }

    if (o > e) {
      if (maxbuf) break; // don't overflow buffer
      l_local_buff += (o - e) + 200; // enlarge buffer
      buf = (char*)realloc(local_buf, l_local_buff);
      e = buf + l_local_buff - 4; // update pointers to buffer content
      o = buf + (o - local_buf);
      word_end = buf + (word_end - local_buf);
      local_buf = buf;
    }

    if (c == '\t') {
      for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf) )%8; c<8 && o<e; c++)
           *o++ = ' ';
    } else if (c == '&' && fl_draw_shortcut && *(p+1)) {
      if (*(p+1) == '&') {p++; *o++ = '&';}
      else if (fl_draw_shortcut != 2) underline_at = o;
    } else if (c < ' ' || c == 127) { // ^X
      *o++ = '^';
      *o++ = c ^ 0x40;
/* This is in fact not useful: the point is that a valid UTF-8 sequence for a non-ascii char contains no ascii char,
 thus no tab, space, control, & or @ we want to process differently.
 Also, invalid UTF-8 sequences are copied unchanged by this procedure.
 Therefore, checking for tab, space, control, & or @, and copying the byte otherwise, is enough.
 } else  if (handle_utf8_seq(p, o)) { // figure out if we have an utf8 valid sequence before we determine the nbsp test validity:
#ifdef __APPLE__
    } else if (c == 0xCA) { // non-breaking space in MacRoman
#else
    } else if (c == 0xA0) { // non-breaking space in ISO 8859
#endif
      *o++ = ' ';*/
    } else if (c == '@' && draw_symbols) { // Symbol???
      if (p[1] && p[1] != '@')  break;
      *o++ = c;
      if (p[1]) p++;
    } else {
      *o++ = c;
    }
  }

  width = w + fl_width(word_end, (int) (o-word_end));
  *o = 0;
  n = (int) (o-buf);
  return p;
}